

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxMemberIdentifier::Resolve(FxMemberIdentifier *this,FCompileContext *ctx)

{
  PStruct *objtype;
  PNamedType *pPVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  FxExpression *pFVar4;
  char *pcVar5;
  char *pcVar6;
  FxExpression *ret_1;
  FxExpression *ret;
  PType *ptype;
  DObject *local_40;
  PSymbol *sym;
  FName local_30;
  int a;
  PStruct *local_28;
  PStruct *ccls;
  FCompileContext *ctx_local;
  FxMemberIdentifier *this_local;
  
  local_28 = (PStruct *)0x0;
  this_local = this;
  if (((this->super_FxIdentifier).super_FxExpression.isresolved & 1U) == 0) {
    (this->super_FxIdentifier).super_FxExpression.isresolved = true;
    ccls = (PStruct *)ctx;
    ctx_local = (FCompileContext *)this;
    if (this->Object->ExprType == EFX_Identifier) {
      FName::FName((FName *)&a,(FName *)(this->Object + 1));
      local_28 = FindStructType((FName *)&a);
      if (local_28 != (PStruct *)0x0) {
        *(undefined1 *)((long)&this->Object[1]._vptr_FxExpression + 4) = 1;
      }
    }
    if (this->Object != (FxExpression *)0x0) {
      iVar3 = (*this->Object->_vptr_FxExpression[2])(this->Object,ccls);
      this->Object = (FxExpression *)CONCAT44(extraout_var,iVar3);
    }
    if (this->Object == (FxExpression *)0x0) {
      if (this != (FxMemberIdentifier *)0x0) {
        (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])();
      }
      this_local = (FxMemberIdentifier *)0x0;
    }
    else {
      FName::FName(&local_30,"allmap");
      bVar2 = FName::operator==(&(this->super_FxIdentifier).Identifier,&local_30);
      if (bVar2) {
        sym._4_4_ = 2;
      }
      if (((this->Object->ValueType == &TypeError->super_PType) && (local_28 != (PStruct *)0x0)) &&
         ((bVar2 = DObject::IsKindOf((DObject *)local_28,PClass::RegistrationInfo.MyClass), !bVar2
          || (((ulong)local_28[1].super_PNamedType.super_PCompoundType.super_PType.HashNext & 0x100)
              != 0)))) {
        pPVar1 = &local_28->super_PNamedType;
        FName::FName((FName *)((long)&ptype + 4),&(this->super_FxIdentifier).Identifier);
        local_40 = (DObject *)
                   PSymbolTable::FindSymbol
                             (&(pPVar1->super_PCompoundType).super_PType.Symbols,
                              (FName *)((long)&ptype + 4),true);
        if (local_40 != (DObject *)0x0) {
          bVar2 = DObject::IsKindOf(local_40,PSymbolConst::RegistrationInfo.MyClass);
          if (!bVar2) {
            pcVar5 = FName::GetChars(&(local_28->super_PNamedType).TypeName);
            pcVar6 = FName::GetChars(&(this->super_FxIdentifier).Identifier);
            FScriptPosition::Message
                      (&(this->super_FxIdentifier).super_FxExpression.ScriptPosition,2,
                       "Unable to access \'%s.%s\' in a static context\n",pcVar5,pcVar6);
            if (this != (FxMemberIdentifier *)0x0) {
              (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])();
            }
            return (FxExpression *)0x0;
          }
          pcVar5 = FName::GetChars(&(local_28->super_PNamedType).TypeName);
          pcVar6 = FName::GetChars(&(this->super_FxIdentifier).Identifier);
          FScriptPosition::Message
                    (&(this->super_FxIdentifier).super_FxExpression.ScriptPosition,8,
                     "Resolving name \'%s.%s\' as constant\n",pcVar5,pcVar6);
          if (this != (FxMemberIdentifier *)0x0) {
            (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])();
          }
          pFVar4 = FxConstant::MakeConstant
                             ((PSymbol *)local_40,
                              &(this->super_FxIdentifier).super_FxExpression.ScriptPosition);
          return pFVar4;
        }
        local_40 = (DObject *)0x0;
      }
      if (this->Object->ValueType == (PType *)TypeColor) {
        this->Object->ValueType = (PType *)TypeColorStruct;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)this->Object->ValueType,
                                  PPointer::RegistrationInfo.MyClass);
        if (bVar2) {
          objtype = (PStruct *)
                    this->Object->ValueType[1].super_PTypeBase.super_DObject._vptr_DObject;
          bVar2 = DObject::IsKindOf((DObject *)objtype,PStruct::RegistrationInfo.MyClass);
          if (bVar2) {
            pFVar4 = FxIdentifier::ResolveMember
                               (&this->super_FxIdentifier,(FCompileContext *)ccls,
                                *(PStruct **)
                                 &(ccls->super_PNamedType).super_PCompoundType.super_PType.Align,
                                &this->Object,objtype);
            if (this == (FxMemberIdentifier *)0x0) {
              return pFVar4;
            }
            (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])();
            return pFVar4;
          }
        }
        else {
          bVar2 = DObject::IsKindOf((DObject *)this->Object->ValueType,
                                    PStruct::RegistrationInfo.MyClass);
          if (bVar2) {
            pFVar4 = FxIdentifier::ResolveMember
                               (&this->super_FxIdentifier,(FCompileContext *)ccls,
                                *(PStruct **)
                                 &(ccls->super_PNamedType).super_PCompoundType.super_PType.Align,
                                &this->Object,(PStruct *)this->Object->ValueType);
            if (this == (FxMemberIdentifier *)0x0) {
              return pFVar4;
            }
            (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])();
            return pFVar4;
          }
        }
      }
      pcVar5 = FName::GetChars(&(this->super_FxIdentifier).Identifier);
      FScriptPosition::Message
                (&(this->super_FxIdentifier).super_FxExpression.ScriptPosition,2,
                 "Left side of %s is not a struct or class",pcVar5);
      if (this != (FxMemberIdentifier *)0x0) {
        (*(this->super_FxIdentifier).super_FxExpression._vptr_FxExpression[1])();
      }
      this_local = (FxMemberIdentifier *)0x0;
    }
  }
  return (FxExpression *)this_local;
}

Assistant:

FxExpression *FxMemberIdentifier::Resolve(FCompileContext& ctx)
{
	PStruct *ccls = nullptr;
	CHECKRESOLVED();

	if (Object->ExprType == EFX_Identifier)
	{
		// If the left side is a class name for a static member function call it needs to be resolved manually 
		// because the resulting value type would cause problems in nearly every other place where identifiers are being used.
		ccls = FindStructType(static_cast<FxIdentifier *>(Object)->Identifier);
		if (ccls != nullptr) static_cast<FxIdentifier *>(Object)->noglobal = true;
	}

	SAFE_RESOLVE(Object, ctx);

	if (Identifier == FName("allmap"))
	{
		int a = 2;
	}

	// check for class or struct constants if the left side is a type name.
	if (Object->ValueType == TypeError)
	{
		if (ccls != nullptr)
		{
			if (!ccls->IsKindOf(RUNTIME_CLASS(PClass)) || static_cast<PClass *>(ccls)->bExported)
			{
				PSymbol *sym;
				if ((sym = ccls->Symbols.FindSymbol(Identifier, true)) != nullptr)
				{
					if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
					{
						ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s.%s' as constant\n", ccls->TypeName.GetChars(), Identifier.GetChars());
						delete this;
						return FxConstant::MakeConstant(sym, ScriptPosition);
					}
					else
					{
						ScriptPosition.Message(MSG_ERROR, "Unable to access '%s.%s' in a static context\n", ccls->TypeName.GetChars(), Identifier.GetChars());
						delete this;
						return nullptr;
					}
				}
			}
		}
	}

	// allow accessing the color channels by mapping the type to a matching struct which defines them.
	if (Object->ValueType == TypeColor)
	{
		Object->ValueType = TypeColorStruct;
	}

	else if (Object->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		auto ptype = static_cast<PPointer *>(Object->ValueType)->PointedType;
		if (ptype->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			auto ret = ResolveMember(ctx, ctx.Class, Object, static_cast<PStruct *>(ptype));
			delete this;
			return ret;
		}
	}
	else if (Object->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
	{
		auto ret = ResolveMember(ctx, ctx.Class, Object, static_cast<PStruct *>(Object->ValueType));
		delete this;
		return ret;
	}

	ScriptPosition.Message(MSG_ERROR, "Left side of %s is not a struct or class", Identifier.GetChars());
	delete this;
	return nullptr;
}